

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

void __thiscall QDateTime::setSecsSinceEpoch(QDateTime *this,qint64 secs)

{
  bool bVar1;
  undefined8 in_RSI;
  Data *in_RDI;
  long in_FS_OFFSET;
  qint64 msecs;
  qint64 in_stack_00000038;
  QDateTime *in_stack_00000040;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = qMulOverflow<long_long,_1000LL>(in_RSI,&local_10);
  if (bVar1) {
    Data::invalidate(in_RDI);
  }
  else {
    setMSecsSinceEpoch(in_stack_00000040,in_stack_00000038);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTime::setSecsSinceEpoch(qint64 secs)
{
    qint64 msecs;
    if (!qMulOverflow(secs, std::integral_constant<qint64, MSECS_PER_SEC>(), &msecs))
        setMSecsSinceEpoch(msecs);
    else
        d.invalidate();
}